

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O3

void __thiscall pg::DTLSolver::search_rec(DTLSolver *this,bitset *R,int player,int depth)

{
  uint uVar1;
  int *piVar2;
  Game *pGVar3;
  uint *puVar4;
  byte bVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  size_t sVar11;
  ostream *poVar12;
  ulong uVar13;
  long lVar14;
  undefined4 in_register_0000000c;
  ulong uVar15;
  int *piVar16;
  int iVar17;
  uint *puVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint64_t *puVar23;
  bitset Z;
  bitset X;
  bitset V;
  _label_vertex local_d0;
  bitset local_c0;
  bitset local_a0;
  uint64_t *local_80;
  int local_78;
  int local_74;
  bitset local_70;
  undefined8 local_50;
  int *local_48;
  uint *local_40;
  bitset *local_38;
  
  local_50 = CONCAT44(in_register_0000000c,depth);
  sVar11 = ((this->super_Solver).game)->n_vertices;
  uVar15 = sVar11 + 0x3f;
  uVar20 = uVar15 >> 6;
  uVar13 = uVar20 * 8;
  local_a0._size = sVar11;
  local_a0._bitssize = uVar20;
  local_a0._allocsize = uVar13;
  local_a0._bits = (uint64_t *)operator_new__(uVar13);
  if (0x3f < uVar15) {
    memset(local_a0._bits,0,uVar13);
  }
  local_70._size = sVar11;
  local_70._bitssize = uVar20;
  local_70._allocsize = uVar13;
  local_70._bits = (uint64_t *)operator_new__(uVar13);
  if (0x3f < uVar15) {
    memset(local_70._bits,0,uVar13);
  }
  local_c0._size = sVar11;
  local_c0._bitssize = uVar20;
  local_c0._allocsize = uVar13;
  local_c0._bits = (uint64_t *)operator_new__(uVar13);
  if (0x3f < uVar15) {
    memset(local_c0._bits,0,uVar13);
  }
  if (1 < (this->super_Solver).trace) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_Solver).logger,"\x1b[1;38;5;202mcurrent region:\x1b[m",0x1f);
    for (sVar11 = bitset::find_first(R); sVar11 != 0xffffffffffffffff;
        sVar11 = bitset::find_next(R,sVar11)) {
      poVar12 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," \x1b[1;38;5;15m",0xd);
      local_d0.g = (this->super_Solver).game;
      local_d0.v = (int)sVar11;
      poVar12 = operator<<(poVar12,&local_d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m",3);
    }
    poVar12 = (this->super_Solver).logger;
    cVar6 = (char)poVar12;
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
  }
  local_74 = 1 - player;
  local_38 = &this->W;
  local_78 = (int)local_50 + 1;
LAB_001766a4:
  do {
    while( true ) {
      if (local_70._bitssize != 0) {
        memset(local_70._bits,0,local_70._bitssize << 3);
      }
      iVar8 = best_vertices(this,&local_70,R,player);
      if (iVar8 == 0) {
        if (local_c0._bits != (uint64_t *)0x0) {
          operator_delete__(local_c0._bits);
        }
        if (local_70._bits != (uint64_t *)0x0) {
          operator_delete__(local_70._bits);
        }
        if (local_a0._bits != (uint64_t *)0x0) {
          operator_delete__(local_a0._bits);
        }
        return;
      }
      if (0 < (this->super_Solver).trace) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_Solver).logger,"\x1b[1;38;5;202mbest vertices:\x1b[m",0x1e);
        for (sVar11 = bitset::find_first(&local_70); sVar11 != 0xffffffffffffffff;
            sVar11 = bitset::find_next(&local_70,sVar11)) {
          poVar12 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," \x1b[1;38;5;15m",0xd);
          local_d0.g = (this->super_Solver).game;
          local_d0.v = (int)sVar11;
          poVar12 = operator<<(poVar12,&local_d0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m",3);
        }
        if (iVar8 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->super_Solver).logger," (stable)",9);
        }
        poVar12 = (this->super_Solver).logger;
        cVar6 = (char)poVar12;
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
      }
      if (iVar8 != 1) break;
      do {
        bitset::operator=(&local_c0,R);
        this->cur_depth = (int)local_50;
        bVar7 = sptl(this,&local_70,local_38,&local_c0,player);
      } while (bVar7);
      if (local_c0._bitssize != 0) {
        memset(local_c0._bits,0,local_c0._bitssize << 3);
      }
      uVar9 = (int)((this->super_Solver).game)->n_vertices - 1;
      if (-1 < (int)uVar9) {
        uVar15 = (ulong)uVar9;
        do {
          uVar13 = uVar15 >> 6;
          if ((local_70._bits[uVar13] >> (uVar15 & 0x3f) & 1) != 0) {
            uVar20 = 1L << (uVar15 & 0x3f);
            if ((local_a0._bits[uVar13] & uVar20) == 0) {
              local_a0._bits[uVar13] = local_a0._bits[uVar13] | uVar20;
              this->str[uVar15] = -1;
              iVar8 = (this->Q).pointer;
              (this->Q).pointer = iVar8 + 1;
              (this->Q).queue[iVar8] = (uint)uVar15;
              iVar8 = (this->Q).pointer;
              while (iVar8 != 0) {
                (this->Q).pointer = iVar8 + -1;
                uVar1 = (this->Q).queue[(long)iVar8 + -1];
                uVar13 = (ulong)(int)uVar1;
                bVar5 = (byte)uVar1 & 0x3f;
                R->_bits[uVar13 >> 6] =
                     R->_bits[uVar13 >> 6] & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                attractVertices(this,player,uVar1,R,&local_a0,R,
                                ((this->super_Solver).game)->_priority[uVar15]);
                piVar16 = this->tin[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar2 = this->tin[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                if (piVar16 != piVar2) {
                  iVar8 = ((this->super_Solver).game)->_priority[uVar15];
                  do {
                    attractTangle(this,*piVar16,player,R,&local_a0,R,iVar8);
                    piVar16 = piVar16 + 1;
                  } while (piVar16 != piVar2);
                }
                iVar8 = (this->Q).pointer;
              }
            }
          }
          bVar7 = 0 < (long)uVar15;
          uVar15 = uVar15 - 1;
        } while (bVar7);
      }
    }
    pGVar3 = (this->super_Solver).game;
    lVar14 = pGVar3->n_vertices;
    if (lVar14 < 1) {
      iVar8 = 0;
    }
    else {
      local_40 = (this->Q).queue;
      local_48 = this->str;
      puVar23 = R->_bits;
      uVar15 = 0;
      iVar8 = 0;
      local_80 = local_c0._bits;
      do {
        uVar13 = uVar15 >> 6;
        if ((puVar23[uVar13] >> (uVar15 & 0x3f) & 1) != 0) {
          iVar10 = iVar8;
          if ((iVar8 < pGVar3->_priority[uVar15]) &&
             (iVar17 = (this->Q).pointer, iVar10 = pGVar3->_priority[uVar15], iVar17 != 0))
          goto LAB_00176af7;
          piVar16 = pGVar3->_outedges;
          uVar22 = 1L << (uVar15 & 0x3f);
          lVar19 = (long)pGVar3->_firstouts[uVar15];
          uVar9 = piVar16[lVar19];
          uVar20 = (ulong)uVar9;
          iVar8 = iVar10;
          if ((uint)(((pGVar3->_owner)._bits[uVar13] & uVar22) != 0) == player) {
            if (uVar9 != 0xffffffff) {
              puVar18 = (uint *)(piVar16 + lVar19 + 1);
              do {
                if ((local_a0._bits[(ulong)(long)(int)uVar20 >> 6] >> ((long)(int)uVar20 & 0x3fU) &
                    1) != 0) goto LAB_00176a98;
                uVar9 = *puVar18;
                uVar20 = (ulong)uVar9;
                puVar18 = puVar18 + 1;
              } while (uVar9 != 0xffffffff);
            }
          }
          else if (uVar9 != 0xffffffff) {
            puVar18 = (uint *)(piVar16 + lVar19);
            bVar7 = false;
            do {
              while( true ) {
                puVar18 = puVar18 + 1;
                uVar21 = (ulong)(long)(int)uVar20 >> 6;
                if ((local_a0._bits[uVar21] >> (uVar20 & 0x3f) & 1) != 0) break;
                if ((puVar23[uVar21] & 1L << (uVar20 & 0x3f)) != 0) goto LAB_00176ad1;
                uVar20 = (ulong)*puVar18;
                if (*puVar18 == 0xffffffff) {
                  if (!bVar7) goto LAB_00176ad1;
                  goto LAB_00176a98;
                }
              }
              uVar20 = (ulong)*puVar18;
              bVar7 = true;
            } while (*puVar18 != 0xffffffff);
LAB_00176a98:
            local_c0._bits[uVar13] = local_c0._bits[uVar13] | uVar22;
            local_48[uVar15] = -1;
            iVar10 = (this->Q).pointer;
            (this->Q).pointer = iVar10 + 1;
            local_40[iVar10] = (uint)uVar15;
            lVar14 = pGVar3->n_vertices;
          }
        }
LAB_00176ad1:
        uVar15 = uVar15 + 1;
      } while ((long)uVar15 < lVar14);
    }
    iVar10 = (int)lVar14;
    iVar17 = (this->Q).pointer;
    if (iVar17 == 0) {
      if (1 < (this->super_Solver).trace) {
        poVar12 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,anon_var_dwarf_285e31,0xd);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        iVar10 = (int)((this->super_Solver).game)->n_vertices;
      }
      if (-1 < (int)(iVar10 - 1U)) {
        puVar23 = (uint64_t *)(ulong)(iVar10 - 1U);
        do {
          uVar15 = (ulong)puVar23 >> 6;
          if ((local_70._bits[uVar15] >> ((ulong)puVar23 & 0x3f) & 1) != 0) {
            uVar13 = 1L << ((ulong)puVar23 & 0x3f);
            if ((local_a0._bits[uVar15] & uVar13) == 0) {
              local_a0._bits[uVar15] = local_a0._bits[uVar15] | uVar13;
              this->str[(long)puVar23] = -1;
              iVar8 = (this->Q).pointer;
              (this->Q).pointer = iVar8 + 1;
              (this->Q).queue[iVar8] = (uint)puVar23;
              iVar8 = (this->Q).pointer;
              while (iVar8 != 0) {
                (this->Q).pointer = iVar8 + -1;
                uVar1 = (this->Q).queue[(long)iVar8 + -1];
                uVar15 = (ulong)(int)uVar1;
                bVar5 = (byte)uVar1 & 0x3f;
                R->_bits[uVar15 >> 6] =
                     R->_bits[uVar15 >> 6] & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                if (2 < (this->super_Solver).trace) {
                  iVar8 = (this->Zvec).pointer;
                  (this->Zvec).pointer = iVar8 + 1;
                  (this->Zvec).queue[iVar8] = uVar1;
                }
                attractVertices(this,player,uVar1,R,&local_a0,R,
                                ((this->super_Solver).game)->_priority[(long)puVar23]);
                piVar16 = this->tin[uVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar2 = this->tin[uVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                if (piVar16 != piVar2) {
                  iVar8 = ((this->super_Solver).game)->_priority[(long)puVar23];
                  do {
                    attractTangle(this,*piVar16,player,R,&local_a0,R,iVar8);
                    piVar16 = piVar16 + 1;
                  } while (piVar16 != piVar2);
                }
                iVar8 = (this->Q).pointer;
              }
              if (1 < (this->super_Solver).trace) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m ",0x11);
                poVar12 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[1;36m",7);
                poVar12 = (ostream *)
                          std::ostream::operator<<
                                    (poVar12,((this->super_Solver).game)->_priority[(long)puVar23]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m",3);
                local_80 = puVar23;
                if ((this->Zvec).pointer != 0) {
                  uVar15 = 0;
                  do {
                    poVar12 = (this->super_Solver).logger;
                    uVar1 = (this->Zvec).queue[uVar15];
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12," \x1b[1;38;5;15m",0xd);
                    local_d0.g = (this->super_Solver).game;
                    local_d0.v = uVar1;
                    poVar12 = operator<<(poVar12,&local_d0);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m",3);
                    if (this->str[(int)uVar1] != -1) {
                      poVar12 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"->",2);
                      local_d0.g = (this->super_Solver).game;
                      local_d0.v = this->str[(int)uVar1];
                      operator<<(poVar12,&local_d0);
                    }
                    uVar15 = uVar15 + 1;
                  } while (uVar15 < (uint)(this->Zvec).pointer);
                }
                poVar12 = (this->super_Solver).logger;
                cVar6 = (char)poVar12;
                std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar6);
                puVar23 = local_80;
                std::ostream::put(cVar6);
                std::ostream::flush();
                (this->Zvec).pointer = 0;
              }
            }
          }
          bVar7 = 0 < (long)puVar23;
          puVar23 = (uint64_t *)((long)puVar23 + -1);
        } while (bVar7);
      }
      goto LAB_001766a4;
    }
LAB_00176af7:
    do {
      (this->Q).pointer = iVar17 + -1;
      uVar1 = (this->Q).queue[(long)iVar17 + -1];
      uVar15 = (ulong)(int)uVar1;
      bVar5 = (byte)uVar1 & 0x3f;
      R->_bits[uVar15 >> 6] =
           R->_bits[uVar15 >> 6] & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      attractVertices(this,player,uVar1,R,&local_c0,R,iVar8);
      piVar2 = this->tin[uVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar16 = this->tin[uVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar16 != piVar2; piVar16 = piVar16 + 1) {
        attractTangle(this,*piVar16,player,R,&local_c0,R,iVar8);
      }
      iVar17 = (this->Q).pointer;
    } while (iVar17 != 0);
    if (1 < (this->super_Solver).trace) {
      poVar12 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,anon_var_dwarf_285e19,0x20);
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,":\x1b[m",4);
      for (sVar11 = bitset::find_first(&local_c0); sVar11 != 0xffffffffffffffff;
          sVar11 = bitset::find_next(&local_c0,sVar11)) {
        poVar12 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," \x1b[1;38;5;15m",0xd);
        local_d0.g = (this->super_Solver).game;
        local_d0.v = (int)sVar11;
        poVar12 = operator<<(poVar12,&local_d0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m",3);
      }
      poVar12 = (this->super_Solver).logger;
      cVar6 = (char)poVar12;
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
    pGVar3 = (this->super_Solver).game;
    uVar9 = (uint)pGVar3->n_vertices;
    uVar15 = (ulong)uVar9;
    if (-1 < (int)(uVar9 - 1)) {
      piVar16 = pGVar3->_priority;
      puVar4 = (this->Q).queue;
      do {
        uVar9 = (int)uVar15 - 1;
        uVar15 = (ulong)uVar9;
        iVar10 = piVar16[uVar15];
        if (iVar10 < iVar8) break;
        if (((local_c0._bits[uVar9 >> 6] >> (uVar15 & 0x3f) & 1) != 0) && (iVar10 == iVar8)) {
          local_a0._bits[uVar9 >> 6] = local_a0._bits[uVar9 >> 6] | 1L << (uVar15 & 0x3f);
          iVar10 = (this->Q).pointer;
          (this->Q).pointer = iVar10 + 1;
          puVar4[iVar10] = uVar9;
        }
      } while (0 < (int)uVar9);
    }
    while( true ) {
      iVar10 = (this->Q).pointer;
      if ((long)iVar10 == 0) break;
      (this->Q).pointer = iVar10 + -1;
      uVar1 = (this->Q).queue[(long)iVar10 + -1];
      bVar5 = (byte)uVar1 & 0x3f;
      local_c0._bits[(ulong)(long)(int)uVar1 >> 6] =
           local_c0._bits[(ulong)(long)(int)uVar1 >> 6] &
           (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      attractVertices(this,local_74,uVar1,&local_c0,&local_a0,&local_c0,iVar8);
    }
    if (local_a0._bitssize != 0) {
      uVar15 = 0;
      do {
        local_a0._bits[uVar15] = local_a0._bits[uVar15] | local_c0._bits[uVar15];
        uVar15 = uVar15 + 1;
      } while (local_a0._bitssize != uVar15);
    }
    search_rec(this,&local_c0,player,local_78);
    if (local_c0._bitssize != 0) {
      memset(local_c0._bits,0,local_c0._bitssize << 3);
    }
  } while( true );
}

Assistant:

void
DTLSolver::search_rec(bitset &R, const int player, const int depth)
{
    bitset X(nodecount()); // vertices removed from R
    bitset V(nodecount()); // the best vertices each iteration
    bitset Z(nodecount()); // holds various subregions
    bitset Z2(nodecount()); // holds various subregions

    if (trace >= 2) {
        logger << "\033[1;38;5;202mcurrent region:\033[m";
        for (auto v = R.find_first(); v != bitset::npos; v = R.find_next(v)) {
            logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
        }
        logger << std::endl;
    }

    while (true) {
        // Compute the best vertices V
        V.reset();
        int result = best_vertices(V, R, player);
        if (result == 0) return; // done

        if (trace >= 1) {
            logger << "\033[1;38;5;202mbest vertices:\033[m";
            for (auto v = V.find_first(); v != bitset::npos; v = V.find_next(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
            }
            if (result == 1) logger << " (stable)";
            logger << std::endl;
        }

        // If the best vertices are stable, run SPTL to learn local dominions and add them to X

        if (result == 1) {
            // Run SPTL for a while
            bool more = true;
            while (more) {
                Z = R;
                cur_depth = depth;
                more = sptl(V, W, Z, player);
            }
            Z.reset();

            // Add Dom(V,R) to X
            for (int top=nodecount()-1; top>=0; top--) {
                if (V[top] and !X[top]) {
                    X[top] = true; // add to <X>
                    str[top] = -1;
                    Q.push(top);
                    while (Q.nonempty()) {
                        const int v = Q.pop();
                        R[v] = false;
                        attractVertices(player, v, R, X, R, priority(top));
                        attractTangles(player, v, R, X, R, priority(top));
                    }
                }
            }

            continue;
        }

        // If the best vertices are not stable, first try to attract to X.
        // Find the lowest threshold to attract to X.

        int t = 0; // initial threshold
        for (int v=0; v<nodecount(); v++) {
            if (R[v]) {
                if (priority(v) > t) {
                    if (Q.nonempty()) break;
                    // update threshold
                    t = priority(v);
                }
                if (attracts(player, v, X, R)) {
                    Z[v] = true;
                    str[v] = -1;
                    Q.push(v);
                }
            }
        }

        if (Q.nonempty()) {
            // Apparently, we found the lowest threshold t, they are in Z
            // Now attract with threshold t from R to Z

            while (Q.nonempty()) {
                const int u = Q.pop();
                R[u] = false;
                attractVertices(player, u, R, Z, R, t);
                attractTangles(player, u, R, Z, R, t);
            }

#ifndef NDEBUG
            if (trace >= 2) {
                logger << "X ∪= attracted with threshold " << t << ":\033[m";
                for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) {
                    logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                }
                logger << std::endl;
            }
#endif

            // Now remove the attractor to threshold vertices from Z (by moving them to X)
            for (int u=nodecount()-1; u >= 0; u--) {
                if (priority(u) < t) break; // done
                if (Z[u] and priority(u) == t) {
                    X[u] = true;
                    Q.push(u);
                }
            }

            while (Q.nonempty()) {
                const int u = Q.pop();
                Z[u] = false;
                attractVertices(1-player, u, Z, X, Z, t);
            }

            // And add all vertices in Z also to X
            X |= Z;

            // Recursively Z
            /*if (depth == 0)*/ search_rec(Z, player, depth+1);
            Z.reset();
        } else {
#ifndef NDEBUG
            if (trace >= 2) logger << "X ∪= Dom(V)" << std::endl;
#endif

            // Add Dom(V,R) to X
            for (int top=nodecount()-1; top>=0; top--) {
                if (V[top] and !X[top]) {
                    X[top] = true; // add to <X>
                    str[top] = -1;
                    Q.push(top);
                    while (Q.nonempty()) {
                        const int v = Q.pop();
                        R[v] = false;
#ifndef NDEBUG
                        if (trace >= 3) Zvec.push(v);
#endif
                        attractVertices(player, v, R, X, R, priority(top));
                        attractTangles(player, v, R, X, R, priority(top));
                    }
#ifndef NDEBUG
                    if (trace >= 2) {
                        // report region
                        logger << "\033[1;33mregion\033[m ";
                        logger << "\033[1;36m" << priority(top) << "\033[m";
                        for (unsigned int i=0; i<Zvec.size(); i++) {
                            int v = Zvec[i];
                            logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                            if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                        }
                        logger << std::endl;
                        Zvec.clear();
                    }
#endif
                }
            }
        }
    }
}